

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

bool testing::internal::
     TypeParameterizedTest<google::protobuf::internal::Utf8ValidationTest,_testing::internal::TemplateSel<google::protobuf::internal::gtest_suite_Utf8ValidationTest_::ReadArbitraryBytes>,_testing::internal::Types<proto2_unittest::TestAllTypes>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  char *__rhs;
  char *str;
  allocator<char> local_189;
  internal *local_188;
  char *local_180 [4];
  string local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  CodeLocation local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  CodeLocation local_58;
  
  local_188 = (internal *)test_names;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,prefix,&local_189);
  __rhs = "/";
  if (*prefix == '\0') {
    __rhs = anon_var_dwarf_651463 + 5;
  }
  std::operator+(&local_120,&local_78,__rhs);
  std::operator+(&local_100,&local_120,case_name);
  std::operator+(&local_e0,&local_100,"/");
  std::operator+(&local_c0,&local_e0,
                 (type_names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + index);
  GetPrefixUntilComma_abi_cxx11_(&local_160,local_188,str);
  StripTrailingSpaces(&local_140,&local_160);
  GetTypeName<proto2_unittest::TestAllTypes>();
  CodeLocation::CodeLocation(&local_a0,code_location);
  set_up_tc = SuiteApiResolver<google::protobuf::internal::gtest_suite_Utf8ValidationTest_::ReadArbitraryBytes<proto2_unittest::TestAllTypes>_>
              ::GetSetUpCaseOrSuite((code_location->file)._M_dataplus._M_p,code_location->line);
  tear_down_tc = SuiteApiResolver<google::protobuf::internal::gtest_suite_Utf8ValidationTest_::ReadArbitraryBytes<proto2_unittest::TestAllTypes>_>
                 ::GetTearDownCaseOrSuite
                           ((code_location->file)._M_dataplus._M_p,code_location->line);
  factory = (TestFactoryBase *)operator_new(8);
  factory->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_01643538;
  MakeAndRegisterTestInfo
            (&local_c0,local_140._M_dataplus._M_p,local_180[0],(char *)0x0,&local_a0,
             &TypeIdHelper<google::protobuf::internal::Utf8ValidationTest<proto2_unittest::TestAllTypes>>
              ::dummy_,set_up_tc,tear_down_tc,factory);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)local_180);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_78);
  CodeLocation::CodeLocation(&local_58,code_location);
  std::__cxx11::string::~string((string *)&local_58);
  return true;
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)]),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>::
        Register(prefix, std::move(code_location), case_name, test_names,
                 index + 1, type_names);
  }